

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::tryToOptimizePropagatedAdd
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this,Expression *oneSide
          ,Expression *otherSide,LocalGet *ptr,LocalSet *set)

{
  Index index_00;
  bool bVar1;
  LocalGet *pLVar2;
  Result RVar3;
  Type local_98;
  Builder local_90;
  LocalGet *local_88;
  LocalGet *get;
  Index local_78;
  bool canReuseIndex;
  Index index;
  Literal local_68;
  byte local_50;
  Result result;
  Const *c;
  LocalSet *set_local;
  LocalGet *ptr_local;
  Expression *otherSide_local;
  Expression *oneSide_local;
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this_local;
  
  result.total.addr = (address64_t)Expression::dynCast<wasm::Const>(oneSide);
  if ((Const *)result.total.addr != (Const *)0x0) {
    bVar1 = Expression::is<wasm::Const>(otherSide);
    if (bVar1) {
      return false;
    }
    wasm::Literal::Literal(&local_68,(Literal *)(result.total.addr + 0x10));
    RVar3 = canOptimizeConstant(this,&local_68);
    result._0_8_ = RVar3.total.addr;
    local_50 = RVar3.succeeded;
    wasm::Literal::~Literal(&local_68);
    if ((local_50 & 1) != 0) {
      local_78 = 0xffffffff;
      get._7_1_ = 0;
      local_88 = Expression::dynCast<wasm::LocalGet>(otherSide);
      if (((local_88 != (LocalGet *)0x0) &&
          (bVar1 = LazyLocalGraph::isSSA(this->localGraph,local_88->index), bVar1)) &&
         (bVar1 = LazyLocalGraph::isSSA(this->localGraph,ptr->index), bVar1)) {
        local_78 = local_88->index;
        get._7_1_ = 1;
      }
      if ((get._7_1_ & 1) == 0) {
        local_78 = OptimizeAddedConstants::getHelperIndex(this->parent,set);
      }
      (this->curr->offset).addr = result._0_8_;
      Builder::Builder(&local_90,this->module);
      index_00 = local_78;
      wasm::Type::Type(&local_98,i32);
      pLVar2 = Builder::makeLocalGet(&local_90,index_00,local_98);
      this->curr->ptr = (Expression *)pLVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool tryToOptimizePropagatedAdd(Expression* oneSide,
                                  Expression* otherSide,
                                  LocalGet* ptr,
                                  LocalSet* set) {
    if (auto* c = oneSide->dynCast<Const>()) {
      if (otherSide->is<Const>()) {
        // Both sides are constant - this is not optimized code, ignore.
        return false;
      }
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        // Looks good, but we need to make sure the other side cannot change:
        //
        //  x = y + 10
        //  y = y + 1
        //  load(x)
        //
        // This example should *not* be optimized into
        //
        //  load(y, offset=10)
        //
        // If the other side is a get, we may be able to prove that we can just
        // use that same local, if both it and the pointer are in SSA form. In
        // that case,
        //
        //  y = .. // single assignment that dominates all uses
        //  x = y + 10 // single assignment that dominates all uses
        //  [..]
        //  load(x) => load(y, offset=10)
        //
        // This is valid since dominance is transitive, so y's definition
        // dominates the load, and it is ok to replace x with y + 10 there.
        Index index = -1;
        bool canReuseIndex = false;
        if (auto* get = otherSide->dynCast<LocalGet>()) {
          if (localGraph->isSSA(get->index) && localGraph->isSSA(ptr->index)) {
            index = get->index;
            canReuseIndex = true;
          }
        }
        // If we can't reuse the index, then create a new one,
        //
        //  x = y + 10
        //  y = y + 1
        //  load(x)
        // =>
        //  y' = y
        //  x = y' + 10
        //  y = y + 1
        //  load(y', offset=10)
        //
        // Often x has no other uses and later passes can remove it.
        if (!canReuseIndex) {
          index = parent->getHelperIndex(set);
        }
        curr->offset = result.total;
        curr->ptr = Builder(*module).makeLocalGet(index, Type::i32);
        return true;
      }
    }
    return false;
  }